

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall
soul::StructuralParser::StructuralParser
          (StructuralParser *this,Allocator *a,CodeLocation *code,ModuleBase *parentScope)

{
  Scope *local_40;
  ModuleBase *parentScope_local;
  CodeLocation *code_local;
  Allocator *a_local;
  StructuralParser *this_local;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::Tokeniser(&this->super_SOULTokeniser);
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)&PTR__StructuralParser_0063b328;
  this->allocator = a;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr(&this->module);
  local_40 = (Scope *)0x0;
  if (parentScope != (ModuleBase *)0x0) {
    local_40 = &parentScope->super_Scope;
  }
  this->currentScope = local_40;
  this->ignoreGreaterThanToken = 0;
  pool_ptr<soul::AST::NoopStatement>::pool_ptr(&this->noop);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::initialise(&this->super_SOULTokeniser,code);
  return;
}

Assistant:

StructuralParser (AST::Allocator& a, const CodeLocation& code, AST::ModuleBase& parentScope)
        : allocator (a), currentScope (std::addressof (parentScope))
    {
        initialise (code);
    }